

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O2

uint * calculate_syndrome(uint *c1,uint c_len,uint t,uint *new_len)

{
  uint len;
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint j;
  ulong uVar6;
  
  len = t * 2;
  if (new_len != (uint *)0x0) {
    *new_len = len;
  }
  puVar2 = vector_new(len);
  for (uVar5 = 1; uVar5 != (len | 1); uVar5 = uVar5 + 1) {
    puVar2[uVar5 - 1] = 0;
    uVar3 = 0;
    uVar4 = 0;
    for (uVar6 = 0; c_len != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = gf_mul(c1[uVar6],alpha_of[uVar3 & 0xff]);
      uVar4 = uVar4 ^ uVar1;
      puVar2[uVar5 - 1] = uVar4;
      uVar3 = uVar3 + uVar5;
    }
  }
  return puVar2;
}

Assistant:

uint32_t *calculate_syndrome(uint32_t *c1, uint32_t c_len, uint32_t t, uint32_t *new_len)
{
    uint32_t len = 2 * t;
    if (new_len != NULL)
        *new_len = len;

    uint32_t *S = vector_new(len);
    for (uint32_t i = 1; i <= len; i++)
    {
        S[i - 1] = 0;
        for (uint32_t j = 0; j < c_len; j++)
            S[i - 1] = gf_sum(S[i - 1], gf_mul(c1[j], alpha_of[i * j % GFsize]));
    }

    return S;
}